

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O1

void __thiscall sfc::Palette::save(Palette *this,string *path)

{
  pointer pSVar1;
  pointer this_00;
  byte_vec_t data;
  byte_vec_t nc;
  Subpalette spp;
  void *local_288;
  undefined8 uStack_280;
  long local_278;
  byte_vec_t local_268;
  string *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  undefined1 local_230 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210 [4];
  ios_base local_138 [264];
  
  local_288 = (void *)0x0;
  uStack_280 = 0;
  local_278 = 0;
  this_00 = (this->_subpalettes).
            super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_250 = path;
  if (this_00 != pSVar1) {
    do {
      Subpalette::padded((Subpalette *)local_230,this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_248,&local_228);
      pack_native_colors(&local_268,&local_248,this->_mode);
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_288,uStack_280,
                 local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      if (local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_268.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(local_210);
      if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pSVar1);
  }
  std::ofstream::ofstream(local_230,(string *)local_250,_S_trunc|_S_out|_S_bin);
  std::ostream::write(local_230,(long)local_288);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_288 != (void *)0x0) {
    operator_delete(local_288,local_278 - (long)local_288);
  }
  return;
}

Assistant:

void Palette::save(const std::string& path) const {
  byte_vec_t data;
  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    auto nc = pack_native_colors(spp.colors(), _mode);
    data.insert(data.end(), nc.begin(), nc.end());
  }
  write_file(path, data);
}